

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O3

int Cudd_DebugCheck(DdManager *table)

{
  int iVar1;
  DdSubtable *pDVar2;
  st__generator *gen;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  DdNode **ppDVar6;
  DdNode **ppDVar7;
  long lVar8;
  long lVar9;
  uint *puVar10;
  DdManager *pDVar11;
  int iVar12;
  DdNode *pDVar13;
  st__table *psVar14;
  uint uVar15;
  int iVar16;
  int count;
  undefined1 local_84 [4];
  DdManager *local_80;
  DdNode **local_78;
  ulong local_70;
  st__table *local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  DdNode **local_48;
  DdNode **local_40;
  long local_38;
  
  local_68 = st__init_table(st__ptrcmp,st__ptrhash);
  iVar12 = -1;
  if (local_68 != (st__table *)0x0) {
    if (table->size == 0) {
      iVar12 = 0;
    }
    else {
      uVar4 = 0;
      iVar12 = 0;
      do {
        local_78 = (DdNode **)(long)table->invperm[uVar4];
        if (uVar4 != (uint)table->perm[(long)local_78]) {
          fprintf((FILE *)table->err,"Permutation corrupted: invperm[%u] = %d\t perm[%d] = %d\n",
                  uVar4 & 0xffffffff,local_78,(ulong)(uint)table->invperm[uVar4]);
        }
        pDVar2 = table->subtables;
        lVar9 = uVar4 * 0x38;
        local_48 = (DdNode **)(long)(int)pDVar2[uVar4].slots;
        local_70 = uVar4;
        if ((long)local_48 < 1) {
          iVar16 = 0;
          local_58 = (ulong)local_58._4_4_ << 0x20;
        }
        else {
          local_60 = pDVar2[uVar4].nodelist;
          ppDVar6 = (DdNode **)0x0;
          local_58 = (ulong)local_58._4_4_ << 0x20;
          iVar16 = 0;
          local_50 = lVar9;
          do {
            local_40 = ppDVar6;
            for (pDVar11 = (DdManager *)local_60[(long)ppDVar6]; local_80 = pDVar11,
                pDVar11 != table; pDVar11 = (DdManager *)(pDVar11->sentinel).next) {
              pDVar13 = (pDVar11->sentinel).type.kids.T;
              if ((pDVar13 == (DdNode *)0x0) || ((pDVar11->sentinel).type.kids.E == (DdNode *)0x0))
              {
LAB_0091aedd:
                fwrite("Error: node has illegal Then or Else pointers\n",0x2e,1,(FILE *)table->err);
                puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                fprintf((FILE *)table->err,
                        "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",puVar10
                        ,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                        *(undefined8 *)(puVar10 + 6));
                iVar12 = 1;
              }
              else if ((pDVar11->sentinel).ref == 0) {
                if ((pDVar11->sentinel).ref != 0) goto LAB_0091aedd;
                local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 1);
              }
              else {
                if ((pDVar11->sentinel).index != (DdHalfWord)local_78) {
                  fwrite("Error: node has illegal index\n",0x1e,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                uVar4 = 0x7fffffff;
                if ((ulong)pDVar13->index != 0x7fffffff) {
                  uVar4 = (ulong)(uint)table->perm[pDVar13->index];
                }
                if (local_70 < uVar4) {
                  uVar4 = (ulong)*(uint *)((ulong)(pDVar11->sentinel).type.kids.E &
                                          0xfffffffffffffffe);
                  uVar5 = 0x7fffffff;
                  if (uVar4 != 0x7fffffff) {
                    uVar5 = (ulong)(uint)table->perm[uVar4];
                  }
                  if (uVar5 <= local_70) goto LAB_0091acdb;
                }
                else {
LAB_0091acdb:
                  fwrite("Error: node has illegal children\n",0x21,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                if (((ulong)pDVar13 & 1) != 0) {
                  fwrite("Error: node has illegal form\n",0x1d,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                if (pDVar13 == (pDVar11->sentinel).type.kids.E) {
                  fwrite("Error: node has identical children\n",0x23,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                if ((pDVar13->ref == 0) ||
                   (*(int *)(((ulong)(pDVar11->sentinel).type.kids.E & 0xfffffffffffffffe) + 4) == 0
                   )) {
                  fwrite("Error: live node has dead children\n",0x23,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                iVar1 = st__lookup_int(local_68,(char *)pDVar13,(int *)local_84);
                psVar14 = local_68;
                pDVar11 = local_80;
                uVar3 = 1;
                if (iVar1 != 0) {
                  uVar3 = (int)local_84 + 1;
                }
                local_84 = (undefined1  [4])uVar3;
                iVar1 = st__insert(local_68,(char *)(local_80->sentinel).type.kids.T,
                                   (char *)(long)(int)uVar3);
                if (iVar1 == -10000) goto LAB_0091b597;
                iVar1 = st__lookup_int(psVar14,(char *)((ulong)(pDVar11->sentinel).type.kids.E &
                                                       0xfffffffffffffffe),(int *)local_84);
                uVar3 = 1;
                if (iVar1 != 0) {
                  uVar3 = (int)local_84 + 1;
                }
                local_84 = (undefined1  [4])uVar3;
                iVar1 = st__insert(local_68,(char *)((ulong)(pDVar11->sentinel).type.kids.E &
                                                    0xfffffffffffffffe),(char *)(long)(int)uVar3);
                psVar14 = local_68;
                if (iVar1 == -10000) goto LAB_0091b597;
              }
              iVar16 = iVar16 + 1;
            }
            ppDVar6 = (DdNode **)((long)local_40 + 1);
          } while (ppDVar6 != local_48);
          pDVar2 = table->subtables;
          lVar9 = local_50;
        }
        if (iVar16 != *(int *)((long)&pDVar2->keys + lVar9)) {
          fwrite("Error: wrong number of total nodes\n",0x23,1,(FILE *)table->err);
          pDVar2 = table->subtables;
          iVar12 = 1;
        }
        uVar4 = local_70;
        if ((int)local_58 != *(int *)((long)&pDVar2->dead + lVar9)) {
          fwrite("Error: wrong number of dead nodes\n",0x22,1,(FILE *)table->err);
          iVar12 = 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (uint)table->size);
    }
    if (table->sizeZ != 0) {
      ppDVar6 = (DdNode **)0x0;
      do {
        local_78 = (DdNode **)(long)table->invpermZ[(long)ppDVar6];
        if (ppDVar6 != (DdNode **)(ulong)(uint)table->permZ[(long)local_78]) {
          fprintf((FILE *)table->err,
                  "Permutation corrupted: invpermZ[%u] = %d\t permZ[%d] = %d in ZDD\n",
                  (ulong)ppDVar6 & 0xffffffff,local_78,(ulong)(uint)table->invpermZ[(long)ppDVar6]);
        }
        pDVar2 = table->subtableZ;
        lVar9 = (long)ppDVar6 * 0x38;
        local_50 = (long)(int)pDVar2[(long)ppDVar6].slots;
        if (local_50 < 1) {
          iVar16 = 0;
          local_60 = (DdNode **)((ulong)local_60._4_4_ << 0x20);
        }
        else {
          local_48 = pDVar2[(long)ppDVar6].nodelist;
          lVar8 = 0;
          local_60 = (DdNode **)((ulong)local_60._4_4_ << 0x20);
          iVar16 = 0;
          local_40 = ppDVar6;
          local_38 = lVar9;
          do {
            local_58 = lVar8;
            for (pDVar11 = (DdManager *)local_48[lVar8]; pDVar11 != (DdManager *)0x0;
                pDVar11 = (DdManager *)(pDVar11->sentinel).next) {
              pDVar13 = (pDVar11->sentinel).type.kids.T;
              local_80 = pDVar11;
              if ((pDVar13 == (DdNode *)0x0) || ((pDVar11->sentinel).type.kids.E == (DdNode *)0x0))
              {
LAB_0091b3c8:
                fwrite("Error: ZDD node has illegal Then or Else pointers\n",0x32,1,
                       (FILE *)table->err);
                puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                fprintf((FILE *)table->err,
                        "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",puVar10
                        ,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                        *(undefined8 *)(puVar10 + 6));
                iVar12 = 1;
              }
              else if ((pDVar11->sentinel).ref == 0) {
                if ((pDVar11->sentinel).ref != 0) goto LAB_0091b3c8;
                local_60 = (DdNode **)CONCAT44(local_60._4_4_,(int)local_60 + 1);
              }
              else {
                if ((pDVar11->sentinel).index != (DdHalfWord)local_78) {
                  fwrite("Error: ZDD node has illegal index\n",0x22,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                if ((((ulong)pDVar13 & 1) != 0) ||
                   ((undefined1  [16])
                    ((undefined1  [16])(pDVar11->sentinel).type & (undefined1  [16])0x1) !=
                    (undefined1  [16])0x0)) {
                  fwrite("Error: ZDD node has complemented children\n",0x2a,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                ppDVar7 = (DdNode **)0x7fffffff;
                if ((ulong)pDVar13->index != 0x7fffffff) {
                  ppDVar7 = (DdNode **)(ulong)(uint)table->permZ[pDVar13->index];
                }
                if (ppDVar6 < ppDVar7) {
                  uVar4 = (ulong)((pDVar11->sentinel).type.kids.E)->index;
                  ppDVar7 = (DdNode **)0x7fffffff;
                  if (uVar4 != 0x7fffffff) {
                    ppDVar7 = (DdNode **)(ulong)(uint)table->permZ[uVar4];
                  }
                  if (ppDVar7 <= ppDVar6) goto LAB_0091b1c6;
                }
                else {
LAB_0091b1c6:
                  fwrite("Error: ZDD node has illegal children\n",0x25,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  puVar10 = (uint *)((ulong)(pDVar11->sentinel).type.kids.T & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  puVar10 = (uint *)((ulong)(pDVar11->sentinel).type.kids.E & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                if (pDVar13 == table->zero) {
                  fwrite("Error: ZDD node has zero then child\n",0x24,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                local_70 = CONCAT44(local_70._4_4_,iVar16);
                if ((pDVar13->ref == 0) || (((pDVar11->sentinel).type.kids.E)->ref == 0)) {
                  fwrite("Error: ZDD live node has dead children\n",0x27,1,(FILE *)table->err);
                  puVar10 = (uint *)((ulong)pDVar11 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar10,(ulong)*puVar10,(ulong)puVar10[1],*(undefined8 *)(puVar10 + 4),
                          *(undefined8 *)(puVar10 + 6));
                  pDVar13 = (pDVar11->sentinel).type.kids.T;
                  iVar12 = 1;
                }
                psVar14 = local_68;
                iVar16 = st__lookup_int(local_68,(char *)pDVar13,(int *)local_84);
                pDVar11 = local_80;
                local_84 = (undefined1  [4])((int)local_84 + 1);
                if (iVar16 == 0) {
                  local_84 = (undefined1  [4])0x1;
                }
                iVar16 = st__insert(psVar14,(char *)(local_80->sentinel).type.kids.T,
                                    (char *)(long)(int)local_84);
                if (iVar16 == -10000) {
LAB_0091b597:
                  st__free_table(psVar14);
                  return -1;
                }
                iVar16 = st__lookup_int(psVar14,(char *)(pDVar11->sentinel).type.kids.E,
                                        (int *)local_84);
                local_84 = (undefined1  [4])((int)local_84 + 1);
                if (iVar16 == 0) {
                  local_84 = (undefined1  [4])0x1;
                }
                iVar1 = st__insert(psVar14,(char *)(pDVar11->sentinel).type.kids.E,
                                   (char *)(long)(int)local_84);
                ppDVar6 = local_40;
                iVar16 = (int)local_70;
                if (iVar1 == -10000) {
                  st__free_table(local_68);
                  table->errorCode = CUDD_MEMORY_OUT;
                  return -1;
                }
              }
              iVar16 = iVar16 + 1;
            }
            lVar8 = local_58 + 1;
          } while (lVar8 != local_50);
          pDVar2 = table->subtableZ;
          local_80 = (DdManager *)0x0;
          lVar9 = local_38;
        }
        if (iVar16 != *(int *)((long)&pDVar2->keys + lVar9)) {
          fwrite("Error: wrong number of total nodes in ZDD\n",0x2a,1,(FILE *)table->err);
          pDVar2 = table->subtableZ;
          iVar12 = 1;
        }
        if ((int)local_60 != *(int *)((long)&pDVar2->dead + lVar9)) {
          fwrite("Error: wrong number of dead nodes in ZDD\n",0x29,1,(FILE *)table->err);
          iVar12 = 1;
        }
        ppDVar6 = (DdNode **)((long)ppDVar6 + 1);
      } while (ppDVar6 < (DdNode **)(ulong)(uint)table->sizeZ);
    }
    local_70 = (ulong)(int)(table->constants).slots;
    if ((long)local_70 < 1) {
      uVar15 = 0;
      uVar3 = 0;
    }
    else {
      local_78 = (table->constants).nodelist;
      lVar9 = 0;
      uVar3 = 0;
      uVar15 = 0;
      do {
        for (pDVar11 = (DdManager *)local_78[lVar9]; pDVar11 != (DdManager *)0x0;
            pDVar11 = (DdManager *)(pDVar11->sentinel).next) {
          if ((pDVar11->sentinel).ref == 0) {
            uVar3 = uVar3 + 1;
          }
          else if ((pDVar11->sentinel).index != 0x7fffffff) {
            local_80 = pDVar11;
            fwrite("Error: node has illegal index\n",0x1e,1,(FILE *)table->err);
            fprintf((FILE *)table->err,"       node 0x%lx, id = %u, ref = %u, value = %g\n",
                    (int)*(undefined8 *)&(pDVar11->sentinel).type,pDVar11,
                    (ulong)(pDVar11->sentinel).index,(ulong)(pDVar11->sentinel).ref);
            iVar12 = 1;
          }
          uVar15 = uVar15 + 1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != local_70);
      local_80 = (DdManager *)0x0;
    }
    if (uVar15 != (table->constants).keys) {
      fwrite("Error: wrong number of total nodes in constants\n",0x30,1,(FILE *)table->err);
      iVar12 = 1;
    }
    if (uVar3 != (table->constants).dead) {
      fwrite("Error: wrong number of dead nodes in constants\n",0x2f,1,(FILE *)table->err);
      iVar12 = 1;
    }
    psVar14 = local_68;
    gen = st__init_gen(local_68);
    iVar16 = st__gen(gen,(char **)&local_80,(char **)local_84);
    if (iVar16 != 0) {
      do {
        uVar3 = (local_80->sentinel).ref;
        if (uVar3 != 0xffffffff && (int)uVar3 < (int)local_84) {
          fprintf((FILE *)table->err,
                  "ref count error at node 0x%lx, count = %d, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n"
                  ,local_80,(ulong)(uint)local_84,(ulong)(local_80->sentinel).index,(ulong)uVar3,
                  (local_80->sentinel).type.value,
                  *(undefined4 *)((long)&(local_80->sentinel).type + 8));
          debugFindParent(table,&local_80->sentinel);
          iVar12 = 1;
        }
        iVar16 = st__gen(gen,(char **)&local_80,(char **)local_84);
      } while (iVar16 != 0);
    }
    st__free_gen(gen);
    st__free_table(psVar14);
  }
  return iVar12;
}

Assistant:

int
Cudd_DebugCheck(
  DdManager * table)
{
    unsigned int i;
    int         j,count;
    int         slots;
    DdNodePtr   *nodelist;
    DdNode      *f;
    DdNode      *sentinel = &(table->sentinel);
    st__table    *edgeTable;     /* stores internal ref count for each node */
    st__generator        *gen;
    int         flag = 0;
    int         totalNode;
    int         deadNode;
    int         index;


    edgeTable = st__init_table( st__ptrcmp, st__ptrhash);
    if (edgeTable == NULL) return(CUDD_OUT_OF_MEM);

    /* Check the BDD/ADD subtables. */
    for (i = 0; i < (unsigned) table->size; i++) {
        index = table->invperm[i];
        if (i != (unsigned) table->perm[index]) {
            (void) fprintf(table->err,
                           "Permutation corrupted: invperm[%u] = %d\t perm[%d] = %d\n",
                           i, index, index, table->perm[index]);
        }
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;

        totalNode = 0;
        deadNode = 0;
        for (j = 0; j < slots; j++) {   /* for each subtable slot */
            f = nodelist[j];
            while (f != sentinel) {
                totalNode++;
                if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref != 0) {
                    if ((int) f->index != index) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal index\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if ((unsigned) cuddI(table,cuddT(f)->index) <= i ||
                        (unsigned) cuddI(table,Cudd_Regular(cuddE(f))->index)
                        <= i) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (Cudd_Regular(cuddT(f)) != cuddT(f)) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal form\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f) == cuddE(f)) {
                        (void) fprintf(table->err,
                                       "Error: node has identical children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f)->ref == 0 || Cudd_Regular(cuddE(f))->ref == 0) {
                        (void) fprintf(table->err,
                                       "Error: live node has dead children\n");
                        cuddPrintNode(f,table->err);
                        flag =1;
                    }
                    /* Increment the internal reference count for the
                    ** then child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddT(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddT(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }

                    /* Increment the internal reference count for the
                    ** else child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)Cudd_Regular(cuddE(f)),
                                      &count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)Cudd_Regular(cuddE(f)),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }
                } else if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref == 0) {
                    deadNode++;
#if 0
                    debugCheckParent(table,f);
#endif
                } else {
                    fprintf(table->err,
                            "Error: node has illegal Then or Else pointers\n");
                    cuddPrintNode(f,table->err);
                    flag = 1;
                }

                f = f->next;
            }   /* for each element of the collision list */
        }       /* for each subtable slot */

        if ((unsigned) totalNode != table->subtables[i].keys) {
            fprintf(table->err,"Error: wrong number of total nodes\n");
            flag = 1;
        }
        if ((unsigned) deadNode != table->subtables[i].dead) {
            fprintf(table->err,"Error: wrong number of dead nodes\n");
            flag = 1;
        }
    }   /* for each BDD/ADD subtable */

    /* Check the ZDD subtables. */
    for (i = 0; i < (unsigned) table->sizeZ; i++) {
        index = table->invpermZ[i];
        if (i != (unsigned) table->permZ[index]) {
            (void) fprintf(table->err,
                           "Permutation corrupted: invpermZ[%u] = %d\t permZ[%d] = %d in ZDD\n",
                           i, index, index, table->permZ[index]);
        }
        nodelist = table->subtableZ[i].nodelist;
        slots = table->subtableZ[i].slots;

        totalNode = 0;
        deadNode = 0;
        for (j = 0; j < slots; j++) {   /* for each subtable slot */
            f = nodelist[j];
            while (f != NULL) {
                totalNode++;
                if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref != 0) {
                    if ((int) f->index != index) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has illegal index\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (Cudd_IsComplement(cuddT(f)) ||
                        Cudd_IsComplement(cuddE(f))) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has complemented children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if ((unsigned) cuddIZ(table,cuddT(f)->index) <= i ||
                    (unsigned) cuddIZ(table,cuddE(f)->index) <= i) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has illegal children\n");
                        cuddPrintNode(f,table->err);
                        cuddPrintNode(cuddT(f),table->err);
                        cuddPrintNode(cuddE(f),table->err);
                        flag = 1;
                    }
                    if (cuddT(f) == DD_ZERO(table)) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has zero then child\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f)->ref == 0 || cuddE(f)->ref == 0) {
                        (void) fprintf(table->err,
                                       "Error: ZDD live node has dead children\n");
                        cuddPrintNode(f,table->err);
                        flag =1;
                    }
                    /* Increment the internal reference count for the
                    ** then child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddT(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddT(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }

                    /* Increment the internal reference count for the
                    ** else child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddE(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddE(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        table->errorCode = CUDD_MEMORY_OUT;
                        return(CUDD_OUT_OF_MEM);
                    }
                } else if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref == 0) {
                    deadNode++;
#if 0
                    debugCheckParent(table,f);
#endif
                } else {
                    fprintf(table->err,
                            "Error: ZDD node has illegal Then or Else pointers\n");
                    cuddPrintNode(f,table->err);
                    flag = 1;
                }

                f = f->next;
            }   /* for each element of the collision list */
        }       /* for each subtable slot */

        if ((unsigned) totalNode != table->subtableZ[i].keys) {
            fprintf(table->err,
                    "Error: wrong number of total nodes in ZDD\n");
            flag = 1;
        }
        if ((unsigned) deadNode != table->subtableZ[i].dead) {
            fprintf(table->err,
                    "Error: wrong number of dead nodes in ZDD\n");
            flag = 1;
        }
    }   /* for each ZDD subtable */

    /* Check the constant table. */
    nodelist = table->constants.nodelist;
    slots = table->constants.slots;

    totalNode = 0;
    deadNode = 0;
    for (j = 0; j < slots; j++) {
        f = nodelist[j];
        while (f != NULL) {
            totalNode++;
            if (f->ref != 0) {
                if (f->index != CUDD_CONST_INDEX) {
                    fprintf(table->err,"Error: node has illegal index\n");
#if SIZEOF_VOID_P == 8
                    fprintf(table->err,
                            "       node 0x%lx, id = %u, ref = %u, value = %g\n",
                            (ptruint)f,f->index,f->ref,cuddV(f));
#else
                    fprintf(table->err,
                            "       node 0x%x, id = %hu, ref = %hu, value = %g\n",
                            (ptruint)f,f->index,f->ref,cuddV(f));
#endif
                    flag = 1;
                }
            } else {
                deadNode++;
            }
            f = f->next;
        }
    }
    if ((unsigned) totalNode != table->constants.keys) {
        (void) fprintf(table->err,
                       "Error: wrong number of total nodes in constants\n");
        flag = 1;
    }
    if ((unsigned) deadNode != table->constants.dead) {
        (void) fprintf(table->err,
                       "Error: wrong number of dead nodes in constants\n");
        flag = 1;
    }
    gen = st__init_gen(edgeTable);
    while ( st__gen(gen, (const char **)&f, (char **)&count)) {
        if (count > (int)(f->ref) && f->ref != DD_MAXREF) {
#if SIZEOF_VOID_P == 8
            fprintf(table->err,"ref count error at node 0x%lx, count = %d, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",(ptruint)f,count,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#else
            fprintf(table->err,"ref count error at node 0x%x, count = %d, id = %hu, ref = %hu, then = 0x%x, else = 0x%x\n",(ptruint)f,count,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#endif
            debugFindParent(table,f);
            flag = 1;
        }
    }
    st__free_gen(gen);
    st__free_table(edgeTable);

    return (flag);

}